

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::hull(SelectionSet *__return_storage_ptr__,SelectionEvaluator *this)

{
  RealType RVar1;
  SelectionSet bs;
  SelectionSet local_50;
  SelectionSet local_38;
  
  createSelectionSets(&local_50,this);
  HullFinder::findHull(&local_38,&this->hullFinder);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::_M_move_assign
            (&local_50.bitsets_,&local_38);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_38.bitsets_);
  RVar1 = (this->hullFinder).volume_;
  this->surfaceArea_ = (this->hullFinder).surfaceArea_;
  this->hasSurfaceArea_ = true;
  this->volume_ = RVar1;
  this->hasVolume_ = true;
  SelectionSet::parallelReduce(__return_storage_ptr__,&local_50);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_50.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::hull() {
    SelectionSet bs = createSelectionSets();

    bs              = hullFinder.findHull();
    surfaceArea_    = hullFinder.getSurfaceArea();
    hasSurfaceArea_ = true;
    volume_         = hullFinder.getVolume();
    hasVolume_      = true;

    return bs.parallelReduce();
  }